

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[24],kj::StringPtr>
          (String *__return_storage_ptr__,kj *this,char (*params) [24],StringPtr *params_1)

{
  char (*value) [24];
  StringPtr *value_00;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  NoInfer<kj::StringPtr> *local_20;
  StringPtr *params_local_1;
  char (*params_local) [24];
  
  local_20 = (NoInfer<kj::StringPtr> *)params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [24])__return_storage_ptr__;
  value = ::const((char (*) [24])this);
  local_30 = toCharSequence<char_const(&)[24]>(value);
  value_00 = fwd<kj::StringPtr>(local_20);
  local_40 = toCharSequence<kj::StringPtr>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,&params_1->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}